

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

void __thiscall TCPServer::on_input(TCPServer *this,Poll *p)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  int *piVar4;
  sockaddr_in __args_2;
  socklen_t client_len;
  shared_ptr<Subscriber> session;
  __shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2> local_50;
  sockaddr_in client;
  
  while( true ) {
    client_len = 0x10;
    iVar1 = Subscriber::get_fd(&this->super_Subscriber);
    iVar1 = accept(iVar1,(sockaddr *)&client,&client_len);
    if (iVar1 < 1) break;
    __args_2.sin_zero = (uchar  [8])client._0_8_;
    __args_2._0_8_ = this;
    std::function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)>::operator()
              ((function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)> *)&session,
               (Poll *)&this->client_factory,(TCPServer *)p,__args_2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Started new tcp session ");
    psVar3 = Subscriber::get_name_abi_cxx11_
                       (session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    Subscriber::set_fd(session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       iVar1);
    std::__shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>);
    Poll::subscribe(p,(shared_ptr<Subscriber> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Subscriber).name);
    poVar2 = std::operator<<(poVar2,": new connection");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&session.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    if (*piVar4 != 0xb) {
      no_err(-1,"accept failed");
    }
  }
  return;
}

Assistant:

void TCPServer::on_input(Poll &p) {
  int connected_fd;
  do {
    struct sockaddr_in client;
    socklen_t client_len = sizeof(client);
    connected_fd = accept(this->get_fd(), (struct sockaddr *) &client, &client_len);
    if (connected_fd > 0) {
      std::shared_ptr<Subscriber> session = client_factory(p, *this, client);
      std::cout << "Started new tcp session " << session->get_name() << std::endl;
      session->set_fd(connected_fd);
      p.subscribe(session);
      std::cout << this->name << ": new connection" << std::endl;
    }
  } while (connected_fd > 0);
  if (connected_fd < 0 && errno != EWOULDBLOCK) {
    no_err(-1, "accept failed");
  }
}